

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorLineEdit.cpp
# Opt level: O2

void __thiscall QColorLineEditPrivate::editingFinished(QColorLineEditPrivate *this)

{
  QColorAction *pQVar1;
  QColorLineEdit *pQVar2;
  QColor QVar3;
  QColor color;
  QArrayDataPointer<char16_t> local_50;
  undefined1 local_38 [16];
  QColor local_28;
  
  QLineEdit::text();
  QColor::setNamedColor((QString *)(local_38 + 0x10));
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = this->action;
  if (local_28.cspec == 0) {
    QVar3 = QColorAction::color(pQVar1);
    local_50.d = QVar3._0_8_;
    local_50.ptr._0_4_ = QVar3.ct._4_4_;
    local_50.ptr._4_2_ = QVar3.ct._8_2_;
    QColorAction::colorIcon((QColorAction *)local_38,(QColor *)pQVar1);
    QAction::setIcon((QIcon *)pQVar1);
    QIcon::~QIcon((QIcon *)local_38);
    pQVar2 = this->widget;
    pQVar1 = this->action;
    QVar3 = QColorAction::color(pQVar1);
    local_38._0_8_ = QVar3._0_8_;
    local_38._8_4_ = QVar3.ct._4_4_;
    local_38._12_2_ = QVar3.ct._8_2_;
    QColorAction::colorName((QString *)&local_50,pQVar1,(QColor *)local_38);
    QLineEdit::setText((QString *)pQVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  else {
    QColorAction::setColor(pQVar1,(QColor *)(local_38 + 0x10));
  }
  return;
}

Assistant:

void editingFinished() {
        const QColor color = QColor(widget->text());

        if (color.isValid()) {
            action->setColor(color);
        } else {
            action->setIcon(action->colorIcon(action->color()));
            widget->setText(action->colorName(action->color()));
        }
    }